

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

void __thiscall
option::PrintUsageImplementation::LineWrapper::process
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  this->wrote_something = false;
  if (0 < len) {
    do {
      if (this->width < len) {
        iVar9 = 0;
        uVar11 = 0;
        do {
          iVar10 = (int)uVar11;
          if ((len - iVar10 == 0 || len < iVar10) || (this->width <= iVar9)) break;
          bVar2 = data[iVar10];
          if (bVar2 < 0xc2) {
            iVar8 = 1;
LAB_0010700c:
            iVar9 = iVar9 + 1;
            iVar12 = 0;
            uVar11 = (ulong)(uint)(iVar8 + iVar10);
          }
          else {
            uVar5 = bVar2 ^ 0xff;
            iVar8 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            uVar5 = ((uint)bVar2 << (~(byte)iVar8 & 0x1f)) >> (~(byte)iVar8 & 0x1f);
            if (iVar10 + 1 < len) {
              lVar6 = 1;
              do {
                iVar8 = (int)lVar6;
                if (0x3f < ((byte)data[iVar10 + (int)lVar6] ^ 0x80)) break;
                uVar5 = uVar5 << 6 ^ (uint)(byte)data[iVar10 + (int)lVar6] ^ 0x80;
                lVar1 = iVar10 + lVar6;
                lVar6 = lVar6 + 1;
                iVar8 = len - iVar10;
              } while (lVar1 + 1 < (long)(ulong)(uint)len);
            }
            else {
              iVar8 = 1;
            }
            iVar12 = 0;
            bVar3 = true;
            if ((0x10ff < uVar5) && (bVar4 = isWideChar(uVar5), bVar4)) {
              iVar12 = 0;
              bVar3 = iVar9 + 2 <= this->width;
              if (bVar3) {
                iVar9 = iVar9 + 1;
              }
              else {
                iVar12 = 5;
              }
            }
            if (bVar3) goto LAB_0010700c;
          }
        } while (iVar12 == 0);
        uVar5 = (uint)uVar11;
        if (uVar5 == len) goto LAB_00107026;
        if (-1 < (int)uVar5) {
          uVar7 = (ulong)(uVar5 + 1);
          uVar13 = uVar11;
          do {
            iVar9 = (int)uVar13;
            if (data[uVar13] == ' ') {
              if (this->tail == this->head) {
                write_one_line(this,write);
              }
              this->lenbuf[this->head] = iVar9;
              iVar10 = this->head;
              this->datbuf[iVar10] = data;
              this->head = iVar10 + 1U & 0xf;
              uVar11 = (ulong)(iVar9 + 1);
              goto LAB_0010713d;
            }
            uVar7 = uVar7 - 1;
            uVar13 = (ulong)(iVar9 - 1);
          } while (0 < iVar9);
        }
        if (this->tail == this->head) {
          write_one_line(this,write);
        }
        this->lenbuf[this->head] = uVar5;
        iVar9 = this->head;
        this->datbuf[iVar9] = data;
        this->head = iVar9 + 1U & 0xf;
        uVar7 = (ulong)(int)uVar5;
LAB_0010713d:
        data = data + uVar7;
        len = len - (int)uVar11;
      }
      else {
LAB_00107026:
        if (this->tail == this->head) {
          write_one_line(this,write);
        }
        this->lenbuf[this->head] = len;
        iVar9 = this->head;
        this->datbuf[iVar9] = data;
        this->head = iVar9 + 1U & 0xf;
        len = 0;
      }
    } while (0 < len);
  }
  if (this->wrote_something == false) {
    write_one_line(this,write);
    return;
  }
  return;
}

Assistant:

void process(IStringWriter& write, const char* data, int len)
    {
      wrote_something = false;

      while (len > 0)
      {
        if (len <= width) // quick test that works because utf8width <= len (all wide chars have at least 2 bytes)
        {
          output(write, data, len);
          len = 0;
        }
        else // if (len > width)  it's possible (but not guaranteed) that utf8len > width
        {
          int utf8width = 0;
          int maxi = 0;
          while (maxi < len && utf8width < width)
          {
            int charbytes = 1;
            unsigned ch = (unsigned char) data[maxi];
            if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
            {
              // int __builtin_clz (unsigned int x)
              // Returns the number of leading 0-bits in x, starting at the most significant bit
              unsigned mask = (unsigned) -1 >> __builtin_clz(ch ^ 0xff);
              ch = ch & mask; // mask out length bits, we don't verify their correctness
              while ((maxi + charbytes < len) && //
                  (((unsigned char) data[maxi + charbytes] ^ 0x80) <= 0x3F)) // while next byte is continuation byte
              {
                ch = (ch << 6) ^ (unsigned char) data[maxi + charbytes] ^ 0x80; // add continuation to char code
                ++charbytes;
              }
              // ch is the decoded unicode code point
              if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
              {
                if (utf8width + 2 > width)
                  break;
                ++utf8width;
              }
            }
            ++utf8width;
            maxi += charbytes;
          }

          // data[maxi-1] is the last byte of the UTF-8 sequence of the last character that fits
          // onto the 1st line. If maxi == len, all characters fit on the line.

          if (maxi == len)
          {
            output(write, data, len);
            len = 0;
          }
          else // if (maxi < len)  at least 1 character (data[maxi] that is) doesn't fit on the line
          {
            int i;
            for (i = maxi; i >= 0; --i)
              if (data[i] == ' ')
                break;

            if (i >= 0)
            {
              output(write, data, i);
              data += i + 1;
              len -= i + 1;
            }
            else // did not find a space to split at => split before data[maxi]
            { // data[maxi] is always the beginning of a character, never a continuation byte
              output(write, data, maxi);
              data += maxi;
              len -= maxi;
            }
          }
        }
      }
      if (!wrote_something) // if we didn't already write something to make space in the buffer
        write_one_line(write); // write at most one line of actual output
    }